

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Selector.cpp
# Opt level: O0

void __thiscall mognetwork::Selector::Selector(Selector *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__Selector_00126a18;
  in_RDI[1] = 0;
  std::__cxx11::list<int,_std::allocator<int>_>::list((list<int,_std::allocator<int>_> *)0x118dc7);
  std::__cxx11::list<int,_std::allocator<int>_>::list((list<int,_std::allocator<int>_> *)0x118dda);
  std::__cxx11::list<int,_std::allocator<int>_>::list((list<int,_std::allocator<int>_> *)0x118dee);
  std::__cxx11::list<int,_std::allocator<int>_>::list((list<int,_std::allocator<int>_> *)0x118dfe);
  *(undefined4 *)(in_RDI + 0x2f) = 0;
  return;
}

Assistant:

Selector::Selector() : m_timeout(NULL), m_maxFds(0) {}